

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

void __thiscall Fad<double>::Fad(Fad<double> *this,int sz,int i,double *x)

{
  double *pdVar1;
  double *pdVar2;
  
  this->val_ = *x;
  (this->dx_).ptr_to_data = (double *)0x0;
  (this->dx_).num_elts = sz;
  pdVar1 = (double *)operator_new__((ulong)(uint)sz * 8);
  (this->dx_).ptr_to_data = pdVar1;
  pdVar2 = pdVar1 + (uint)sz;
  do {
    pdVar2[-1] = 0.0;
    pdVar2 = pdVar2 + -1;
  } while (pdVar1 < pdVar2);
  this->defaultVal = 0.0;
  pdVar1[i] = 1.0;
  return;
}

Assistant:

Fad(const int sz, const int i, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0))
    {dx_[i]=1.;}